

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_weapons.cpp
# Opt level: O3

void __thiscall FWeaponSlots::LocalSetup(FWeaponSlots *this,PClassActor *type)

{
  int iVar1;
  FString *this_00;
  FString sectionclass;
  FString local_20;
  
  P_PlaybackKeyConfWeapons(this);
  if (*(int *)(WeaponSection.Chars + -0xc) != 0) {
    FString::AttachToOther(&local_20,&WeaponSection);
    this_00 = FString::operator+=(&local_20,'.');
    FString::operator+=(this_00,FName::NameData.NameArray
                                [(type->super_PClass).super_PStruct.super_PNamedType.TypeName.Index]
                                .Text);
    iVar1 = RestoreSlots(this,&GameConfig->super_FConfigFile,local_20.Chars);
    if (iVar1 == 0) {
      RestoreSlots(this,&GameConfig->super_FConfigFile,WeaponSection.Chars);
    }
    FString::~FString(&local_20);
    return;
  }
  RestoreSlots(this,&GameConfig->super_FConfigFile,
               FName::NameData.NameArray
               [(type->super_PClass).super_PStruct.super_PNamedType.TypeName.Index].Text);
  return;
}

Assistant:

void FWeaponSlots::LocalSetup(PClassActor *type)
{
	P_PlaybackKeyConfWeapons(this);
	if (WeaponSection.IsNotEmpty())
	{
		FString sectionclass(WeaponSection);
		sectionclass << '.' << type->TypeName.GetChars();
		if (RestoreSlots(GameConfig, sectionclass) == 0)
		{
			RestoreSlots(GameConfig, WeaponSection);
		}
	}
	else
	{
		RestoreSlots(GameConfig, type->TypeName.GetChars());
	}
}